

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

Values * __thiscall
Fixpp::
get<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<711u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::ComponentBlock<Fixpp::TagT<311u,Fixpp::Type::String>,Fixpp::TagT<312u,Fixpp::Type::String>,Fixpp::TagT<309u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>,Fixpp::TagT<462u,Fixpp::Type::Int>,Fixpp::TagT<463u,Fixpp::Type::String>,Fixpp::TagT<310u,Fixpp::Type::String>,Fixpp::TagT<763u,Fixpp::Type::String>,Fixpp::TagT<313u,Fixpp::Type::String>,Fixpp::TagT<542u,Fixpp::Type::String>,Fixpp::TagT<241u,Fixpp::Type::String>,Fixpp::TagT<242u,Fixpp::Type::String>,Fixpp::TagT<243u,Fixpp::Type::Int>,Fixpp::TagT<244u,Fixpp::Type::Int>,Fixpp::TagT<245u,Fixpp::Type::Float>,Fixpp::TagT<246u,Fixpp::Type::Float>,Fixpp::TagT<256u,Fixpp::Type::String>,Fixpp::TagT<595u,Fixpp::Type::String>,Fixpp::TagT<592u,Fixpp::Type::Strin___pp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>>>>>
          (Values *__return_storage_ptr__,Fixpp *this,InstanceGroupRef<_b8373603_> *message)

{
  bool bVar1;
  runtime_error *this_00;
  
  bVar1 = std::bitset<45UL>::test((bitset<45UL> *)(this + 0x1b48),3);
  if (bVar1) {
    llvm::
    SmallVector<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_10U>
    ::SmallVector(__return_storage_ptr__,
                  (SmallVector<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_10U>
                   *)(this + 0x30));
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Bad tag access: tag is not present in message");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

decltype(auto)
    get(const Message& message)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        static_assert(Index::Valid, "Invalid tag for given message");

        if (!message.allBits.test(static_cast<size_t>(Index::Value)))
            throw std::runtime_error("Bad tag access: tag is not present in message");

        return meta::get<Index::Value>(message.values).get();
    }